

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

void __thiscall ThreadPool::start(ThreadPool *this)

{
  uint uVar1;
  thread local_48;
  __shared_ptr<ThreadPool,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this->m_isRunning = true;
  if (this->m_threadnum != 0) {
    uVar1 = 0;
    do {
      std::__shared_ptr<ThreadPool,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ThreadPool,void>
                (local_40,(__weak_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::thread::
      thread<std::shared_ptr<ThreadPool>(&)(std::shared_ptr<ThreadPool>),std::shared_ptr<ThreadPool>,void>
                (&local_48,threadfun,(shared_ptr<ThreadPool> *)local_40);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->m_threads,&local_48);
      if (local_48._M_id._M_thread != 0) {
        std::terminate();
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_threadnum);
  }
  return;
}

Assistant:

void ThreadPool::start()
{
	m_isRunning=true;
	for (int i = 0; i < m_threadnum; i++) {	
		m_threads.push_back(std::thread(threadfun,shared_from_this()));
		
	}
}